

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-timed.c
# Opt level: O0

_Bool player_of_has_not_timed(player *p,wchar_t flag)

{
  _Bool _Var1;
  object *obj_00;
  object *obj;
  bitflag local_1e [2];
  wchar_t i;
  bitflag f [5];
  bitflag collect_f [5];
  wchar_t flag_local;
  player *p_local;
  
  unique0x100000e2 = flag;
  player_flags(p,(bitflag *)((long)&i + 3));
  for (obj._4_4_ = L'\0'; obj._4_4_ < (int)(uint)(p->body).count; obj._4_4_ = obj._4_4_ + L'\x01') {
    obj_00 = slot_object(p,obj._4_4_);
    if (obj_00 != (object *)0x0) {
      object_flags(obj_00,local_1e);
      flag_union((bitflag *)((long)&i + 3),local_1e,5);
    }
  }
  _Var1 = flag_has_dbg((bitflag *)((long)&i + 3),5,stack0xffffffffffffffec,"collect_f","flag");
  return _Var1;
}

Assistant:

static bool player_of_has_not_timed(struct player *p, int flag)
{
    bitflag collect_f[OF_SIZE], f[OF_SIZE];
    int i;

    player_flags(p, collect_f);

    for (i = 0; i < p->body.count; i++) {
        struct object *obj = slot_object(p, i);

        if (!obj) continue;
        object_flags(obj, f);
        of_union(collect_f, f);
    }

    return of_has(collect_f, flag);
}